

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

void helicsInputSetDefaultVector
               (HelicsInput inp,double *vectorInput,int vectorLength,HelicsError *err)

{
  long lVar1;
  HelicsInput pvVar2;
  allocator_type local_29;
  vector<double,_std::allocator<double>_> local_28;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (inp == (HelicsInput)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a9c5c;
    }
    else {
      pvVar2 = (HelicsInput)0x0;
      if (*inp == 0x3456e052) {
        pvVar2 = inp;
      }
      if (*inp == 0x3456e052 || err == (HelicsError *)0x0) goto LAB_001a9c5e;
    }
    err->error_code = -3;
    err->message = "The given input object does not point to a valid object";
  }
LAB_001a9c5c:
  pvVar2 = (HelicsInput)0x0;
LAB_001a9c5e:
  if (pvVar2 != (HelicsInput)0x0) {
    lVar1 = *(long *)((long)pvVar2 + 0x18);
    if (vectorInput == (double *)0x0 || vectorLength < 1) {
      local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
    }
    else {
      std::vector<double,std::allocator<double>>::vector<double_const*,void>
                ((vector<double,std::allocator<double>> *)&local_28,vectorInput,
                 vectorInput + (uint)vectorLength,&local_29);
    }
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)(lVar1 + 0x70),&local_28);
    if (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void helicsInputSetDefaultVector(HelicsInput inp, const double* vectorInput, int vectorLength, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return;
    }
    try {
        if ((vectorInput == nullptr) || (vectorLength <= 0)) {
            inpObj->inputPtr->setDefault(std::vector<double>{});
        } else {
            inpObj->inputPtr->setDefault(std::vector<double>(vectorInput, vectorInput + vectorLength));
        }
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}